

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

void __thiscall HEkk::clear(HEkk *this)

{
  pointer pdVar1;
  
  HighsLp::clear(&this->lp_);
  std::__cxx11::string::_M_replace
            ((ulong)&this->lp_name_,0,(char *)(this->lp_name_)._M_string_length,0x3cbf27);
  clearEkkDualize(this);
  clearEkkData(this);
  pdVar1 = (this->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  pdVar1 = (this->scattered_dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->scattered_dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish != pdVar1) {
    (this->scattered_dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  this->callback_ = (HighsCallback *)0x0;
  this->options_ = (HighsOptions *)0x0;
  this->timer_ = (HighsTimer *)0x0;
  SimplexBasis::clear(&this->basis_);
  HSimplexNla::clear(&this->simplex_nla_);
  (this->status_).initialised_for_new_lp = false;
  (this->status_).initialised_for_solve = false;
  (this->status_).has_basis = false;
  (this->status_).has_ar_matrix = false;
  (this->status_).has_nla = false;
  (this->status_).has_dual_steepest_edge_weights = false;
  (this->status_).has_invert = false;
  (this->status_).has_fresh_invert = false;
  (this->status_).has_fresh_rebuild = false;
  (this->status_).has_dual_objective_value = false;
  (this->status_).has_primal_objective_value = false;
  (this->dual_ray_record_).index = -1;
  (this->dual_ray_record_).sign = 0;
  pdVar1 = (this->dual_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->dual_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->dual_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  (this->primal_ray_record_).index = -1;
  (this->primal_ray_record_).sign = 0;
  pdVar1 = (this->primal_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->primal_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->primal_ray_record_).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  return;
}

Assistant:

void HEkk::clear() {
  // Clears Ekk entirely. Clears all associated pointers, data scalars
  // and vectors, and the status values.
  this->clearEkkLp();
  this->clearEkkDualize();
  this->clearEkkData();
  this->clearEkkDualEdgeWeightData();
  this->clearEkkPointers();
  this->basis_.clear();
  this->simplex_nla_.clear();
  this->clearEkkAllStatus();
  this->clearRayRecords();
}